

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O0

void __thiscall CheckStructure::check(CheckStructure *this,string *x)

{
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [32];
  string *local_18;
  string *x_local;
  CheckStructure *this_local;
  
  this->m_countCalls = this->m_countCalls + 1;
  local_18 = x;
  x_local = &this->m_sMainType;
  switch(this->m_countCalls) {
  case 1:
    std::__cxx11::string::string(local_38,(string *)x);
    isType(this,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    break;
  case 2:
    std::__cxx11::string::string(local_68,(string *)x);
    isMain(this,(string *)local_68);
    std::__cxx11::string::~string(local_68);
    break;
  case 3:
    std::__cxx11::string::string(local_88,(string *)x);
    isOpenedPar(this,(string *)local_88);
    std::__cxx11::string::~string(local_88);
    break;
  case 4:
    std::__cxx11::string::string(local_a8,(string *)x);
    isClosedPar(this,(string *)local_a8);
    std::__cxx11::string::~string(local_a8);
    break;
  case 5:
    std::__cxx11::string::string(local_c8,(string *)x);
    isOpenedBody(this,(string *)local_c8);
    std::__cxx11::string::~string(local_c8);
    break;
  case 6:
    std::__cxx11::string::string(local_e8,(string *)x);
    isReturn(this,(string *)local_e8);
    std::__cxx11::string::~string(local_e8);
    break;
  case 7:
    std::__cxx11::string::string(local_108,(string *)x);
    isTypeOfReturnValue(this,(string *)local_108);
    std::__cxx11::string::~string(local_108);
    break;
  case 8:
    std::__cxx11::string::string(local_128,(string *)x);
    isClosedStatement(this,(string *)local_128);
    std::__cxx11::string::~string(local_128);
    break;
  case 9:
    std::__cxx11::string::string(local_148,(string *)x);
    isClosedBody(this,(string *)local_148);
    std::__cxx11::string::~string(local_148);
  }
  return;
}

Assistant:

void CheckStructure::check(string x) {
    m_countCalls++;
    switch (m_countCalls) {
        case 1:
            isType(x);
            break;
        case 2:
            isMain(x);
            break;
        case 3:
            isOpenedPar(x);
            break;
        case 4:
            isClosedPar(x);
            break;
        case 5:
            isOpenedBody(x);
            break;
        case 6:
            isReturn(x);
            break;
        case 7:
            isTypeOfReturnValue(x);
            break;
        case 8:
            isClosedStatement(x);
            break;
        case 9:
            isClosedBody(x);
            break;
        default:
            break;
    }
}